

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int commit_raw_message(ptls_message_emitter_t *_self)

{
  size_t sVar1;
  size_t local_20;
  size_t epoch;
  st_ptls_raw_message_emitter_t *self;
  ptls_message_emitter_t *_self_local;
  
  sVar1 = _self->enc->epoch;
  if ((sVar1 == 1) && (*(uint8_t *)((long)&(_self[1].buf)->base + (long)_self->buf->base) == '\x01')
     ) {
    local_20 = 0;
    sVar1 = local_20;
  }
  while( true ) {
    local_20 = sVar1 + 1;
    if (4 < local_20) {
      _self[1].buf = (ptls_buffer_t *)0xffffffffffffffff;
      return 0;
    }
    if (*(ptls_buffer_t **)((_self[1].enc)->secret + sVar1 * 8 + 8) != _self[1].buf) break;
    *(size_t *)((_self[1].enc)->secret + sVar1 * 8 + 8) = _self->buf->off;
    sVar1 = local_20;
  }
  __assert_fail("self->epoch_offsets[epoch] == self->start_off",
                "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/lib/picotls.c",
                0x140e,"int commit_raw_message(ptls_message_emitter_t *)");
}

Assistant:

static int commit_raw_message(ptls_message_emitter_t *_self)
{
    struct st_ptls_raw_message_emitter_t *self = (void *)_self;
    size_t epoch;

    /* epoch is the key epoch, with the only exception being 2nd CH generated after 0-RTT key */
    epoch = self->super.enc->epoch;
    if (epoch == 1 && self->super.buf->base[self->start_off] == PTLS_HANDSHAKE_TYPE_CLIENT_HELLO)
        epoch = 0;

    for (++epoch; epoch < 5; ++epoch) {
        assert(self->epoch_offsets[epoch] == self->start_off);
        self->epoch_offsets[epoch] = self->super.buf->off;
    }

    self->start_off = SIZE_MAX;

    return 0;
}